

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

Data2D<double> *
readMatrixFromOpen<TasGrid::IO::mode_binary_type>
          (Data2D<double> *__return_storage_ptr__,istream *is)

{
  int new_num_strips;
  IO *this;
  int a;
  istream *is_00;
  unsigned_long in_RCX;
  vector<double,_std::allocator<double>_> local_38;
  int local_20;
  int local_1c;
  int cols;
  int rows;
  istream *is_local;
  
  _cols = is;
  is_local = (istream *)__return_storage_ptr__;
  local_1c = TasGrid::IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  a = TasGrid::IO::readNumber<TasGrid::IO::mode_binary_type,int>(_cols);
  this = (IO *)_cols;
  new_num_strips = local_1c;
  local_20 = a;
  is_00 = (istream *)TasGrid::Utils::size_mult<int,int>(a,local_1c);
  TasGrid::IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
            (&local_38,this,is_00,in_RCX);
  TasGrid::Data2D<double>::Data2D<int,int>(__return_storage_ptr__,a,new_num_strips,&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Data2D<double> readMatrixFromOpen(std::istream &is){
    int rows = IO::readNumber<iomode, int>(is);
    int cols = IO::readNumber<iomode, int>(is);
    return Data2D<double>(cols, rows, IO::readVector<iomode, double>(is, Utils::size_mult(cols, rows)));
}